

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O3

block * gen_mcode(compiler_state_t *cstate,char *s1,char *s2,uint masklen,qual q)

{
  int iVar1;
  undefined8 in_RAX;
  block *pbVar2;
  uint uVar3;
  char *fmt;
  bpf_u_int32 m;
  bpf_u_int32 n;
  undefined8 local_38;
  
  local_38 = in_RAX;
  iVar1 = __pcap_atoin(s1,(bpf_u_int32 *)((long)&local_38 + 4));
  uVar3 = local_38._4_4_ << (-(char)iVar1 & 0x1fU);
  local_38._4_4_ = uVar3;
  if (s2 == (char *)0x0) {
    if (0x20 < masklen) {
      fmt = "mask length must be <= 32";
      goto LAB_0010e5ac;
    }
    local_38._0_4_ = -1 << (-(char)masklen & 0x1fU);
    if (masklen == 0) {
      local_38._0_4_ = 0;
    }
    if ((uVar3 & ~(uint)local_38) != 0) {
      bpf_error(cstate,"non-network bits set in \"%s/%d\"",s1,(ulong)masklen);
    }
  }
  else {
    iVar1 = __pcap_atoin(s2,(bpf_u_int32 *)&local_38);
    local_38._0_4_ = (uint)local_38 << (-(char)iVar1 & 0x1fU);
    if ((local_38._4_4_ & ~(uint)local_38) != 0) {
      bpf_error(cstate,"non-network bits set in \"%s mask %s\"",s1,s2);
    }
  }
  if (q.addr == '\x02') {
    pbVar2 = gen_host(cstate,local_38._4_4_,(uint)local_38,(uint)q >> 8 & 0xff,
                      (uint)q >> 0x10 & 0xff,2);
    return pbVar2;
  }
  fmt = "Mask syntax for networks only";
LAB_0010e5ac:
  bpf_error(cstate,fmt);
}

Assistant:

struct block *
gen_mcode(compiler_state_t *cstate, const char *s1, const char *s2,
    unsigned int masklen, struct qual q)
{
	register int nlen, mlen;
	bpf_u_int32 n, m;

	nlen = __pcap_atoin(s1, &n);
	/* Promote short ipaddr */
	n <<= 32 - nlen;

	if (s2 != NULL) {
		mlen = __pcap_atoin(s2, &m);
		/* Promote short ipaddr */
		m <<= 32 - mlen;
		if ((n & ~m) != 0)
			bpf_error(cstate, "non-network bits set in \"%s mask %s\"",
			    s1, s2);
	} else {
		/* Convert mask len to mask */
		if (masklen > 32)
			bpf_error(cstate, "mask length must be <= 32");
		if (masklen == 0) {
			/*
			 * X << 32 is not guaranteed by C to be 0; it's
			 * undefined.
			 */
			m = 0;
		} else
			m = 0xffffffff << (32 - masklen);
		if ((n & ~m) != 0)
			bpf_error(cstate, "non-network bits set in \"%s/%d\"",
			    s1, masklen);
	}

	switch (q.addr) {

	case Q_NET:
		return gen_host(cstate, n, m, q.proto, q.dir, q.addr);

	default:
		bpf_error(cstate, "Mask syntax for networks only");
		/* NOTREACHED */
	}
	/* NOTREACHED */
	return NULL;
}